

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O2

QJsonValueRef __thiscall
QJsonObject::atImpl<QLatin1StringView>(QJsonObject *this,QLatin1StringView key)

{
  QCborContainerPrivate *pQVar1;
  qsizetype idx;
  long in_FS_OFFSET;
  QJsonValueRef QVar2;
  bool keyExists;
  QJsonValue local_68;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->o).d.ptr == (QCborContainerPrivate *)0x0) {
    pQVar1 = (QCborContainerPrivate *)operator_new(0x40);
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    pQVar1->usedData = 0;
    (pQVar1->data).d.d = (Data *)0x0;
    (pQVar1->data).d.ptr = (char *)0x0;
    (pQVar1->data).d.size = 0;
    (pQVar1->elements).d.d = (Data *)0x0;
    (pQVar1->elements).d.ptr = (Element *)0x0;
    (pQVar1->elements).d.size = 0;
    QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->o,pQVar1);
  }
  keyExists = false;
  idx = indexOf<QLatin1StringView>(&this->o,key,&keyExists);
  if (keyExists == false) {
    detach(this,((ulong)(((this->o).d.ptr)->elements).d.size >> 1) + 1);
    pQVar1 = (this->o).d.ptr;
    QCborValue::QCborValue(&local_50,key);
    QCborContainerPrivate::insertAt(pQVar1,idx,&local_50,CopyContainer);
    QCborValue::~QCborValue(&local_50);
    pQVar1 = (this->o).d.ptr;
    QJsonValue::QJsonValue(&local_68,Null);
    QCborValue::fromJsonValue(&local_50,&local_68);
    QCborContainerPrivate::insertAt(pQVar1,idx + 1,&local_50,CopyContainer);
    QCborValue::~QCborValue(&local_50);
    QJsonValue::~QJsonValue(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar2.super_QJsonValueConstRef._8_8_ = (idx / 2) * 2 + 1;
    QVar2.super_QJsonValueConstRef.d = (this->o).d.ptr;
    return (QJsonValueRef)QVar2.super_QJsonValueConstRef;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValueRef QJsonObject::atImpl(T key)
{
    if (!o)
        o = new QCborContainerPrivate;

    bool keyExists = false;
    auto index = indexOf(o, key, &keyExists);
    if (!keyExists) {
        detach(o->elements.size() / 2 + 1);
        o->insertAt(index, key);
        o->insertAt(index + 1, QCborValue::fromJsonValue(QJsonValue()));
    }
    // detaching will happen if and when this QJsonValueRef is assigned to
    return QJsonValueRef(this, index / 2);
}